

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

exr_result_t exr_write_header(exr_context_t ctxt)

{
  pthread_mutex_t *__mutex;
  uint uVar1;
  int iVar2;
  exr_priv_part_t p_Var3;
  exr_priv_part_t *pp_Var4;
  exr_result_t eVar5;
  int32_t val;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE_00;
  uint64_t uVar6;
  char *pcVar7;
  exr_context_t nonc;
  long lVar8;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  ulong uVar9;
  
  if (ctxt == (exr_context_t)0x0) {
    eVar5 = 2;
  }
  else {
    __mutex = &ctxt->mutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (ctxt->mode != '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      eVar5 = (*ctxt->standard_error)(ctxt,8);
      return eVar5;
    }
    uVar1 = ctxt->num_parts;
    if ((ulong)uVar1 == 0) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      UNRECOVERED_JUMPTABLE_00 = ctxt->report_error;
      pcVar7 = "No parts defined in file prior to writing data";
LAB_00119164:
      eVar5 = (*UNRECOVERED_JUMPTABLE_00)(ctxt,6,pcVar7);
      return eVar5;
    }
    if ((int)(uint)((int)uVar1 < 2) < (int)uVar1) {
      uVar9 = (ulong)((int)uVar1 < 2);
      do {
        if (ctxt->parts[uVar9]->name == (exr_attribute_t *)0x0) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          UNRECOVERED_JUMPTABLE = ctxt->print_error;
          pcVar7 = "Part %d missing required name for multi-part file";
          eVar5 = 3;
          goto LAB_0011923a;
        }
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
    }
    uVar9 = 0;
    do {
      if ((long)ctxt->num_parts <= (long)uVar9) {
        ctxt->output_file_offset = 0;
        eVar5 = internal_exr_write_header(ctxt);
        if (eVar5 == 0) {
          ctxt->mode = '\x03';
          ctxt->cur_output_part = 0;
          ctxt->last_output_chunk = -1;
          ctxt->output_chunk_count = 0;
          iVar2 = ctxt->num_parts;
          if (0 < (long)iVar2) {
            uVar6 = ctxt->output_file_offset;
            pp_Var4 = ctxt->parts;
            lVar8 = 0;
            do {
              p_Var3 = pp_Var4[lVar8];
              p_Var3->chunk_table_offset = uVar6;
              uVar6 = uVar6 + (long)p_Var3->chunk_count * 8;
              lVar8 = lVar8 + 1;
            } while (iVar2 != lVar8);
            ctxt->output_file_offset = uVar6;
          }
          eVar5 = 0;
        }
        goto LAB_0011910d;
      }
      p_Var3 = ctxt->parts[uVar9];
      if (p_Var3->channels == (exr_attribute_t *)0x0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        UNRECOVERED_JUMPTABLE = ctxt->print_error;
        pcVar7 = "Part %d is missing channel list";
        eVar5 = 0xd;
LAB_0011923a:
        eVar5 = (*UNRECOVERED_JUMPTABLE)(ctxt,eVar5,pcVar7,uVar9 & 0xffffffff,UNRECOVERED_JUMPTABLE)
        ;
        return eVar5;
      }
      eVar5 = internal_exr_compute_tile_information(ctxt,p_Var3,0);
      if (eVar5 != 0) break;
      val = internal_exr_compute_chunk_offset_size(p_Var3);
      if (val < 0) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        UNRECOVERED_JUMPTABLE_00 = ctxt->report_error;
        pcVar7 = "Invalid part specification computing number of chunks in file";
        goto LAB_00119164;
      }
      p_Var3->chunk_count = val;
      if ((ctxt->has_nonimage_data != '\0') || (ctxt->is_multipart != '\0')) {
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        eVar5 = exr_attr_set_int(ctxt,(int)uVar9,"chunkCount",val);
        pthread_mutex_lock((pthread_mutex_t *)__mutex);
        if (eVar5 != 0) break;
      }
      eVar5 = internal_exr_validate_write_part(ctxt,p_Var3);
      uVar9 = uVar9 + 1;
    } while (eVar5 == 0);
    ctxt->output_file_offset = 0;
LAB_0011910d:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  return eVar5;
}

Assistant:

exr_result_t
exr_write_header (exr_context_t ctxt)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;
    internal_exr_lock (ctxt);

    if (ctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN (
            ctxt->standard_error (ctxt, EXR_ERR_NOT_OPEN_WRITE));

    if (ctxt->num_parts == 0)
        return EXR_UNLOCK_AND_RETURN (ctxt->report_error (
            ctxt,
            EXR_ERR_FILE_BAD_HEADER,
            "No parts defined in file prior to writing data"));

    /* add part and set name should have already validated the uniqueness
     * so just ensure the name has been set for multi part files
     */
    for ( int p = ctxt->num_parts > 1 ? 0 : 1; p < ctxt->num_parts; ++p )
    {
        const exr_attribute_t* pname = ctxt->parts[p]->name;
        if (!pname)
        {
            return EXR_UNLOCK_AND_RETURN (
                ctxt->print_error (
                    ctxt,
                    EXR_ERR_INVALID_ARGUMENT,
                    "Part %d missing required name for multi-part file",
                    p));
        }
    }

    for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
    {
        exr_priv_part_t curp = ctxt->parts[p];

        int32_t ccount = 0;

        if (!curp->channels)
            return EXR_UNLOCK_AND_RETURN (ctxt->print_error (
                ctxt,
                EXR_ERR_MISSING_REQ_ATTR,
                "Part %d is missing channel list",
                p));

        rv = internal_exr_compute_tile_information (ctxt, curp, 0);
        if (rv != EXR_ERR_SUCCESS) break;

        ccount = internal_exr_compute_chunk_offset_size (curp);
        if (ccount < 0)
            return EXR_UNLOCK_AND_RETURN (
                ctxt->report_error (
                    ctxt,
                    EXR_ERR_FILE_BAD_HEADER,
                    "Invalid part specification computing number of chunks in file"));

        curp->chunk_count = ccount;

        if (ctxt->has_nonimage_data || ctxt->is_multipart)
        {
            internal_exr_unlock (ctxt);
            rv = exr_attr_set_int (ctxt, p, EXR_REQ_CHUNK_COUNT_STR, ccount);
            internal_exr_lock (ctxt);
            if (rv != EXR_ERR_SUCCESS) break;
        }

        rv = internal_exr_validate_write_part (ctxt, curp);
    }

    ctxt->output_file_offset = 0;

    if (rv == EXR_ERR_SUCCESS) rv = internal_exr_write_header (ctxt);

    if (rv == EXR_ERR_SUCCESS)
    {
        ctxt->mode               = EXR_CONTEXT_WRITING_DATA;
        ctxt->cur_output_part    = 0;
        ctxt->last_output_chunk  = -1;
        ctxt->output_chunk_count = 0;
        for (int p = 0; rv == EXR_ERR_SUCCESS && p < ctxt->num_parts; ++p)
        {
            exr_priv_part_t curp = ctxt->parts[p];

            curp->chunk_table_offset = ctxt->output_file_offset;
            ctxt->output_file_offset +=
                (uint64_t) (curp->chunk_count) * sizeof (uint64_t);
        }
    }

    return EXR_UNLOCK_AND_RETURN (rv);
}